

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

void __thiscall Moc::parsePrivateProperty(Moc *this,ClassDef *def,PropertyMode mode)

{
  long lVar1;
  Data *pDVar2;
  qsizetype qVar3;
  Data *data;
  char *pcVar4;
  long in_FS_OFFSET;
  QByteArray local_1a8;
  PropertyDef local_188;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->super_Parser).index;
  if ((lVar1 < (this->super_Parser).symbols.d.size) &&
     ((this->super_Parser).symbols.d.ptr[lVar1].token == LPAREN)) {
    (this->super_Parser).index = lVar1 + 1;
    memset(&local_188,0xaa,0x158);
    memset(&local_188,0,0x138);
    local_188.notifyId = -1;
    local_188._316_7_ = 0;
    local_188.revision._3_1_ = 0;
    local_188.typeTag.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
         (QFlagsStorageHelper<TypeTag,_4>)0x0;
    local_188.constant = false;
    local_188.final = false;
    local_188.required = false;
    local_188.relativeIndex = -1;
    local_188.location = -1;
    parsePropertyAccessor(&local_1a8,this);
    pcVar4 = local_188.inPrivateClass.d.ptr;
    data = local_188.inPrivateClass.d.d;
    qVar3 = local_1a8.d.size;
    pDVar2 = local_1a8.d.d;
    local_1a8.d.d = local_188.inPrivateClass.d.d;
    local_188.inPrivateClass.d.d = pDVar2;
    local_188.inPrivateClass.d.ptr = local_1a8.d.ptr;
    local_1a8.d.ptr = pcVar4;
    local_1a8.d.size = local_188.inPrivateClass.d.size;
    local_188.inPrivateClass.d.size = qVar3;
    if (&data->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&data->super_QArrayData,1,0x10);
      }
    }
    lVar1 = (this->super_Parser).index;
    if ((lVar1 < (this->super_Parser).symbols.d.size) &&
       ((this->super_Parser).symbols.d.ptr[lVar1].token == COMMA)) {
      (this->super_Parser).index = lVar1 + 1;
      createPropertyDef(this,&local_188,(int)(def->propertyList).d.size,mode);
      QtPrivate::QMovableArrayOps<PropertyDef>::emplace<PropertyDef_const&>
                ((QMovableArrayOps<PropertyDef> *)&def->propertyList,(def->propertyList).d.size,
                 &local_188);
      QList<PropertyDef>::end(&def->propertyList);
      PropertyDef::~PropertyDef(&local_188);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      __stack_chk_fail();
    }
  }
  Parser::error(&this->super_Parser,(char *)0x0);
}

Assistant:

void Moc::parsePrivateProperty(ClassDef *def, Moc::PropertyMode mode)
{
    next(LPAREN);
    PropertyDef propDef;
    propDef.inPrivateClass = parsePropertyAccessor();

    next(COMMA);

    createPropertyDef(propDef, int(def->propertyList.size()), mode);

    def->propertyList += propDef;
}